

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef::~IfcCircleHollowProfileDef
          (IfcCircleHollowProfileDef *this)

{
  ~IfcCircleHollowProfileDef
            ((IfcCircleHollowProfileDef *)
             &this[-1].super_IfcCircleProfileDef.super_IfcParameterizedProfileDef.
              super_IfcProfileDef.ProfileName);
  return;
}

Assistant:

IfcCircleHollowProfileDef() : Object("IfcCircleHollowProfileDef") {}